

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# RelativeWorldCoordinates.cpp
# Opt level: O3

KString * __thiscall
KDIS::DATA_TYPE::RelativeWorldCoordinates::GetAsString_abi_cxx11_
          (KString *__return_storage_ptr__,RelativeWorldCoordinates *this)

{
  ostream *poVar1;
  KFLOAT32 KVar2;
  KStringStream ss;
  stringstream local_1a0 [16];
  ostream local_190 [112];
  ios_base local_120 [264];
  
  std::__cxx11::stringstream::stringstream(local_1a0);
  std::__ostream_insert<char,std::char_traits<char>>(local_190,"Relative World Coordinates",0x1a);
  std::__ostream_insert<char,std::char_traits<char>>(local_190,"\n\tReference Point: ",0x13);
  poVar1 = std::ostream::_M_insert<unsigned_long>((ulong)local_190);
  std::__ostream_insert<char,std::char_traits<char>>(poVar1,", Delta-X: ",0xb);
  KVar2 = KFIXED<short,_(unsigned_char)'\x03'>::GetAsFloat32(&this->m_DelX);
  poVar1 = std::ostream::_M_insert<double>((double)(float)KVar2);
  std::__ostream_insert<char,std::char_traits<char>>(poVar1,", Delta-Y: ",0xb);
  KVar2 = KFIXED<short,_(unsigned_char)'\x03'>::GetAsFloat32(&this->m_DelY);
  poVar1 = std::ostream::_M_insert<double>((double)(float)KVar2);
  std::__ostream_insert<char,std::char_traits<char>>(poVar1,", Delta-Z: ",0xb);
  KVar2 = KFIXED<short,_(unsigned_char)'\x03'>::GetAsFloat32(&this->m_DelZ);
  poVar1 = std::ostream::_M_insert<double>((double)(float)KVar2);
  std::__ostream_insert<char,std::char_traits<char>>(poVar1,"\n",1);
  std::__cxx11::stringbuf::str();
  std::__cxx11::stringstream::~stringstream(local_1a0);
  std::ios_base::~ios_base(local_120);
  return __return_storage_ptr__;
}

Assistant:

KString RelativeWorldCoordinates::GetAsString() const
{
    KStringStream ss;

    ss << "Relative World Coordinates"
       << "\n\tReference Point: " << m_ui16RefPnt
       << ", Delta-X: " << m_DelX.GetAsFloat32()
       << ", Delta-Y: " << m_DelY.GetAsFloat32()
       << ", Delta-Z: " << m_DelZ.GetAsFloat32()
       << "\n";

    return ss.str();
}